

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O0

void __thiscall
xray_re::xr_sound_src_object::xr_sound_src_object(xr_sound_src_object *this,xr_scene *scene)

{
  xr_scene *scene_local;
  xr_sound_src_object *this_local;
  
  xr_custom_object::xr_custom_object(&this->super_xr_custom_object,scene,TOOLS_CLASS_SOUND_SRC);
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_sound_src_object_0038df28;
  *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 1;
  this->m_type = '\0';
  std::__cxx11::string::string((string *)&this->m_source_name);
  this->m_volume = 1.0;
  this->m_frequency = 1.0;
  this->m_min_dist = 1.0;
  this->m_max_dist = 30.0;
  this->m_max_ai_dist = 30.0;
  _vector3<float>::set(&this->m_sound_pos,0.0,0.0,0.0);
  _vector2<float>::set(&this->m_pause_time,0.0,0.0);
  _vector2<float>::set(&this->m_active_time,0.0,0.0);
  _vector2<float>::set(&this->m_play_time,0.0,0.0);
  return;
}

Assistant:

xr_sound_src_object::xr_sound_src_object(xr_scene& scene):
	xr_custom_object(scene, TOOLS_CLASS_SOUND_SRC),
	m_flags(0x1), m_type(0),
	m_volume(1.f), m_frequency(1.f),
	m_min_dist(1.f), m_max_dist(30.f), m_max_ai_dist(30.f)
{
	m_sound_pos.set();
	m_pause_time.set();
	m_active_time.set();
	m_play_time.set();
}